

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void pop_back(cache *Cache)

{
  int x;
  size_t sVar1;
  void *label;
  int iVar2;
  int iVar3;
  
  iVar2 = -10;
  do {
    if (iVar2 == 0) {
      return;
    }
    if (Cache->length != 0) {
      x = Cache->last;
      iVar3 = Cache->records[x].last;
      Cache->records[x].valid = false;
      cache_stack_push(Cache,x);
      label = (*Cache->get_label)(Cache->records + Cache->last);
      reset_hash_node(&Cache->label_hash,label);
      Cache->used_size = Cache->used_size - (long)Cache->records[Cache->last].size;
      (*Cache->realse)(Cache->records + Cache->last);
      Cache->records[iVar3].next = -1;
      Cache->last = iVar3;
      sVar1 = Cache->length;
      Cache->length = sVar1 - 1;
      if (sVar1 != 2) {
        if (sVar1 != 1) goto LAB_00103247;
        Cache->last = 0;
        iVar3 = 0;
      }
      Cache->first = iVar3;
    }
LAB_00103247:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void pop_back(cache* Cache) {
  //移除若干条数据
  int t = LRU_POP_ITEM;
  struct record_data*pd,*tmp;
  int count =0;
  while ((t--)) {
    if (Cache->length > 0) {

      
      //重新链接大链表
      int next_to_last = Cache->records[Cache->last].last; //最后一个的上一个
      Cache->records[Cache->last].valid = 0;
      //压入可选栈
      cache_stack_push(Cache,Cache->last);

      //重置hash表
      // bool is_find;
      // get_hashnode(&Cache->label_hash,Cache->get_label(&Cache->records[Cache->last]),&is_find);
      // if(is_find){
      //   printf("ok");
      // }else{
      //   printf("error");
      // }
      reset_hash_node(&Cache->label_hash,Cache->get_label(&Cache->records[Cache->last]));
      // puts(Cache->get_label(&Cache->records[Cache->last]));
      Cache->used_size -= Cache->records[Cache->last].size;//减去动态分配内存
      Cache->realse(&Cache->records[Cache->last]);

      //重新链接大链表
      // Cache->used_size -= record_size;
      Cache->records[next_to_last].next = -1;

      Cache->last = next_to_last;
      Cache->length--;

      if (Cache->length == 1) {
        Cache->first = Cache->last;
      } else if (Cache->length == 0) {
        Cache->first = Cache->last = LRU_BUFFER_HEAD_POINT; //头结点
      }
    }
  }
}